

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::NextBuffer
          (EpsCopyInputStream *this,int overrun,int depth)

{
  char *pcVar1;
  int *piVar2;
  char *pcVar3;
  byte bVar4;
  undefined8 uVar5;
  int iVar6;
  LogMessage *pLVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  size_t __n;
  pair<const_char_*,_int> pVar13;
  void *data;
  LogFinisher local_71;
  char *local_70;
  LogMessage local_68;
  
  pcVar11 = this->next_chunk_;
  if (pcVar11 == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar1 = this->buffer_;
  if (pcVar11 != pcVar1) {
    iVar6 = this->size_;
    if (iVar6 < 0x11) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0x69);
      pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: size_ > kSlopBytes: ");
      LogFinisher::operator=((LogFinisher *)&local_70,pLVar7);
      LogMessage::~LogMessage(&local_68);
      pcVar11 = this->next_chunk_;
      iVar6 = this->size_;
    }
    this->buffer_end_ = pcVar11 + (long)iVar6 + -0x10;
    this->next_chunk_ = pcVar1;
    if (this->aliasing_ != 1) {
      return pcVar11;
    }
    this->aliasing_ = 2;
    return pcVar11;
  }
  uVar5 = *(undefined8 *)(this->buffer_end_ + 8);
  *(undefined8 *)pcVar1 = *(undefined8 *)this->buffer_end_;
  *(undefined8 *)(this->buffer_ + 8) = uVar5;
  if (this->overall_limit_ < 1) goto LAB_00320344;
  if (-1 < depth) {
    if (overrun < 0) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0x35);
      pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: overrun >= 0: ");
      LogFinisher::operator=((LogFinisher *)&local_70,pLVar7);
      LogMessage::~LogMessage(&local_68);
LAB_00320380:
      pcVar3 = this->buffer_ + 0x10;
      pcVar8 = pcVar1 + overrun;
      do {
        bVar4 = *pcVar8;
        uVar10 = (uint)bVar4;
        pcVar9 = pcVar8 + 1;
        if ((char)bVar4 < '\0') {
          uVar10 = ((uint)bVar4 + (uint)(byte)*pcVar9 * 0x80) - 0x80;
          if (*pcVar9 < '\0') {
            pcVar9 = pcVar8 + 3;
            lVar12 = -0x15;
            while (uVar10 = ((byte)pcVar9[-1] - 1 << ((char)lVar12 + 0x23U & 0x1f)) + uVar10,
                  pcVar9[-1] < '\0') {
              pcVar9 = pcVar9 + 1;
              lVar12 = lVar12 + 7;
              if (lVar12 == 0) goto switchD_003203dc_default;
            }
          }
          else {
            pcVar9 = pcVar8 + 2;
          }
        }
        if (pcVar3 < pcVar9) break;
        if (uVar10 == 0) goto LAB_00320344;
        switch(uVar10 & 7) {
        case 0:
          pcVar9 = VarintParse<unsigned_long>(pcVar9,(unsigned_long *)&local_68);
          if (pcVar9 == (char *)0x0) goto switchD_003203dc_default;
          break;
        case 1:
          pcVar9 = pcVar9 + 8;
          break;
        case 2:
          uVar10 = (uint)(byte)*pcVar9;
          if (*pcVar9 < '\0') {
            pVar13 = ReadSizeFallback(pcVar9,uVar10);
            uVar10 = pVar13.second;
            pcVar9 = pVar13.first;
            if (pcVar9 == (char *)0x0) goto switchD_003203dc_default;
          }
          else {
            pcVar9 = pcVar9 + 1;
          }
          if ((long)pcVar3 - (long)pcVar9 < (long)(int)uVar10) goto switchD_003203dc_default;
          pcVar9 = pcVar9 + (int)uVar10;
          break;
        case 3:
          depth = depth + 1;
          break;
        case 4:
          if (depth < 1) goto LAB_00320344;
          depth = depth + -1;
          break;
        case 5:
          pcVar9 = pcVar9 + 4;
          break;
        default:
          goto switchD_003203dc_default;
        }
        pcVar8 = pcVar9;
      } while (pcVar9 < pcVar3);
    }
    else if ((uint)overrun < 0x11) {
      if (overrun != 0x10) goto LAB_00320380;
    }
    else {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0x36);
      pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: overrun <= kSlopBytes: ");
      LogFinisher::operator=((LogFinisher *)&local_70,pLVar7);
      LogMessage::~LogMessage(&local_68);
    }
  }
switchD_003203dc_default:
  piVar2 = &this->size_;
  iVar6 = (*this->zcis_->_vptr_ZeroCopyInputStream[2])(this->zcis_,&local_70,piVar2);
  if ((char)iVar6 != '\0') {
    do {
      iVar6 = this->size_;
      __n = (size_t)iVar6;
      this->overall_limit_ = this->overall_limit_ - iVar6;
      if (0x10 < (long)__n) {
        uVar5 = *(undefined8 *)(local_70 + 8);
        *(undefined8 *)(this->buffer_ + 0x10) = *(undefined8 *)local_70;
        *(undefined8 *)(this->buffer_ + 0x18) = uVar5;
        this->next_chunk_ = local_70;
        this->buffer_end_ = this->buffer_ + 0x10;
LAB_003204c4:
        if (this->aliasing_ < 2) {
          return pcVar1;
        }
        this->aliasing_ = 1;
        return pcVar1;
      }
      if (0 < iVar6) {
        memcpy(this->buffer_ + 0x10,local_70,__n);
        this->next_chunk_ = pcVar1;
        this->buffer_end_ = pcVar1 + __n;
        goto LAB_003204c4;
      }
      if (iVar6 != 0) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                   ,0x89);
        pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: size_ == 0: ");
        pLVar7 = LogMessage::operator<<(pLVar7,*piVar2);
        LogFinisher::operator=(&local_71,pLVar7);
        LogMessage::~LogMessage(&local_68);
      }
      iVar6 = (*this->zcis_->_vptr_ZeroCopyInputStream[2])(this->zcis_,&local_70,piVar2);
    } while ((char)iVar6 != '\0');
  }
  this->overall_limit_ = 0;
LAB_00320344:
  if (this->aliasing_ == 2) {
    this->aliasing_ = (long)this->buffer_end_ - (long)pcVar11;
  }
  this->next_chunk_ = (char *)0x0;
  this->buffer_end_ = this->buffer_ + 0x10;
  this->size_ = 0;
  return pcVar1;
}

Assistant:

const char* EpsCopyInputStream::NextBuffer(int overrun, int depth) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != buffer_) {
    GOOGLE_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // buffer_.
  std::memmove(buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (depth < 0 || !ParseEndsInSlopRegion(buffer_, overrun, depth))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      } else if (size_ > 0) {
        std::memcpy(buffer_ + kSlopBytes, data, size_);
        next_chunk_ = buffer_;
        buffer_end_ = buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      }
      GOOGLE_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = buffer_ + kSlopBytes;
  size_ = 0;
  return buffer_;
}